

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

void __thiscall cppcms::crypto::hmac::hmac(hmac *this,string *name,key *k)

{
  message_digest *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  invalid_argument *this_00;
  string *ctx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->d).ptr_ = (data_ *)0x0;
  (this->md_)._M_t.
  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
       (message_digest *)0x0;
  (this->md_opad_)._M_t.
  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
       (message_digest *)0x0;
  crypto::key::key(&this->key_,k);
  ctx = name;
  message_digest::create_by_name((message_digest *)&local_48,name);
  pmVar1 = (this->md_)._M_t.
           super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ._M_t.
           super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
           .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  (this->md_)._M_t.
  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
       (message_digest *)local_48._M_dataplus._M_p;
  if (pmVar1 != (message_digest *)0x0) {
    (*pmVar1->_vptr_message_digest[1])(pmVar1);
    local_48._M_dataplus._M_p =
         (pointer)(this->md_)._M_t.
                  super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
                  .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
  }
  if ((message_digest *)local_48._M_dataplus._M_p != (message_digest *)0x0) {
    iVar2 = (*((message_digest *)local_48._M_dataplus._M_p)->_vptr_message_digest[6])();
    pmVar1 = (this->md_opad_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
    (this->md_opad_)._M_t.
    super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ._M_t.
    super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
    .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
         (message_digest *)CONCAT44(extraout_var,iVar2);
    if (pmVar1 != (message_digest *)0x0) {
      (*pmVar1->_vptr_message_digest[1])();
    }
    init(this,(EVP_PKEY_CTX *)ctx);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x30);
  std::operator+(&local_48,"Invalid or unsupported hash function:",name);
  booster::invalid_argument::invalid_argument(this_00,&local_48);
  __cxa_throw(this_00,&booster::invalid_argument::typeinfo,
              booster::invalid_argument::~invalid_argument);
}

Assistant:

hmac::hmac(std::string const &name,key const &k) : key_(k)
	{
		md_ = message_digest::create_by_name(name);
		if(!md_.get()) {
			throw booster::invalid_argument("Invalid or unsupported hash function:" + name);
		}
		md_opad_.reset(md_->clone());
		init();
	}